

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

void Gia_ManSimRelAssignInputs
               (Gia_Man_t *p,int nWords,Vec_Wrd_t *vSims,int nWordsIn,Vec_Wrd_t *vSimsIn)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj;
  word *__dest;
  word *__src;
  bool bVar3;
  int local_3c;
  int nMints;
  int Id;
  int m;
  int i;
  Vec_Wrd_t *vSimsIn_local;
  int nWordsIn_local;
  Vec_Wrd_t *vSims_local;
  int nWords_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_WrdSize(vSims);
  iVar2 = Gia_ManObjNum(p);
  if (iVar1 != nWords * iVar2) {
    __assert_fail("Vec_WrdSize(vSims) == nWords * Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x2ed,
                  "void Gia_ManSimRelAssignInputs(Gia_Man_t *, int, Vec_Wrd_t *, int, Vec_Wrd_t *)")
    ;
  }
  iVar1 = Vec_WrdSize(vSimsIn);
  iVar2 = Gia_ManCiNum(p);
  if (iVar1 == nWordsIn * iVar2) {
    Id = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCis);
      bVar3 = false;
      if (Id < iVar1) {
        pObj = Gia_ManCi(p,Id);
        local_3c = Gia_ObjId(p,pObj);
        bVar3 = local_3c != 0;
      }
      if (!bVar3) break;
      for (nMints = 0; nMints < nWords / nWordsIn; nMints = nMints + 1) {
        __dest = Vec_WrdEntryP(vSims,local_3c * nWords + nWordsIn * nMints);
        __src = Vec_WrdEntryP(vSimsIn,Id * nWordsIn);
        memcpy(__dest,__src,(long)nWordsIn << 3);
      }
      Id = Id + 1;
    }
    return;
  }
  __assert_fail("Vec_WrdSize(vSimsIn) == nWordsIn * Gia_ManCiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                ,0x2ee,
                "void Gia_ManSimRelAssignInputs(Gia_Man_t *, int, Vec_Wrd_t *, int, Vec_Wrd_t *)");
}

Assistant:

void Gia_ManSimRelAssignInputs( Gia_Man_t * p, int nWords, Vec_Wrd_t * vSims, int nWordsIn, Vec_Wrd_t * vSimsIn )
{
    int i, m, Id, nMints = nWords / nWordsIn;
    assert( Vec_WrdSize(vSims)   == nWords   * Gia_ManObjNum(p) );
    assert( Vec_WrdSize(vSimsIn) == nWordsIn * Gia_ManCiNum(p) );
    Gia_ManForEachCiId( p, Id, i )
        for ( m = 0; m < nMints; m++ )
            memcpy( Vec_WrdEntryP(vSims, Id * nWords + nWordsIn * m), 
                    Vec_WrdEntryP(vSimsIn, i * nWordsIn), sizeof(word) * nWordsIn );
}